

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementUtilities.cpp
# Opt level: O3

bool Rml::ElementUtilities::GetClippingRegion
               (Element *element,Rectanglei *out_clip_region,
               ClipMaskGeometryList *out_clip_mask_list,bool force_clip_self)

{
  pointer *ppCVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  byte bVar6;
  iterator __position;
  bool bVar7;
  CommonValues CVar8;
  uint uVar9;
  ComputedValues *pCVar10;
  TransformState *this;
  Matrix4f *pMVar11;
  ElementBackgroundBorder *this_00;
  Element *this_01;
  Vector2f VVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  bool bVar16;
  byte bVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  Rectanglef element_region;
  BoxArea local_ec;
  Rectangle<float> local_c0;
  Element *local_b0;
  Vector2f local_a8;
  Rectanglei *local_90;
  undefined1 local_88 [24];
  Matrix4f *pMStack_70;
  Vector2f local_58;
  float local_48;
  
  local_b0 = element;
  pCVar10 = Element::GetComputedValues(element);
  bVar6 = (pCVar10->rare).clip.value;
  bVar17 = 0;
  if (bVar6 != 0xff || force_clip_self) {
    VVar12._1_7_ = 0;
    VVar12.x._0_1_ = bVar6;
    uVar13 = 0;
    if ('\0' < (char)bVar6) {
      uVar13 = (uint)bVar6;
    }
    this_01 = local_b0;
    if ((force_clip_self) ||
       (this_01 = Element::GetOffsetParent(local_b0), this_01 != (Element *)0x0)) {
      local_c0 = (Rectangle<float>)(ZEXT816(0xbf800000bf800000) << 0x40);
      local_90 = out_clip_region;
      do {
        bVar15 = this_01 == local_b0;
        pCVar10 = Element::GetComputedValues(this_01);
        CVar8 = pCVar10->common;
        bVar6 = (pCVar10->rare).clip.value;
        uVar9 = (uint)bVar6;
        if (bVar6 == 0) {
          bVar7 = false;
LAB_00232757:
          bVar16 = ((undefined1  [96])CVar8 & (undefined1  [96])0x3c00) != (undefined1  [96])0x0;
          VVar12.x._0_1_ = uVar13 == 0 && bVar16 || bVar15 && force_clip_self;
          if (uVar13 == 0 && bVar16 || bVar15 && force_clip_self) {
            if (bVar15 && force_clip_self) {
              local_ec = Border;
LAB_00232816:
              bVar15 = false;
            }
            else {
              local_ec = Element::GetClipArea(this_01);
              fVar19 = Element::GetClientWidth(this_01);
              fVar18 = Element::GetScrollWidth(this_01);
              if (fVar19 < fVar18 + -0.5) goto LAB_00232816;
              fVar19 = Element::GetClientHeight(this_01);
              fVar18 = Element::GetScrollHeight(this_01);
              bVar15 = fVar18 + -0.5 <= fVar19;
            }
            fVar19 = VVar12.x;
            if (out_clip_mask_list == (ClipMaskGeometryList *)0x0) {
              bVar16 = false;
            }
            else {
              this = Element::GetTransformState(this_01);
              if (this == (TransformState *)0x0) {
                pMVar11 = (Matrix4f *)0x0;
              }
              else {
                pMVar11 = TransformState::GetTransform(this);
              }
              uVar2 = (pCVar10->rare).border_top_left_radius;
              uVar3 = (pCVar10->rare).border_top_right_radius;
              uVar4 = (pCVar10->rare).border_bottom_right_radius;
              uVar5 = (pCVar10->rare).border_bottom_left_radius;
              auVar20._0_2_ = -(ushort)(0 < (short)uVar2);
              auVar20._2_2_ = -(ushort)(0 < (short)uVar2);
              auVar20._4_2_ = -(ushort)(0 < (short)uVar3);
              auVar20._6_2_ = -(ushort)(0 < (short)uVar3);
              auVar20._8_2_ = -(ushort)(0 < (short)uVar4);
              auVar20._10_2_ = -(ushort)(0 < (short)uVar4);
              auVar20._12_2_ = -(ushort)(0 < (short)uVar5);
              auVar20._14_2_ = -(ushort)(0 < (short)uVar5);
              VVar12.x = (float)movmskps(fVar19,auVar20);
              VVar12.y = 0.0;
              if ((VVar12.x != 0.0) || (pMVar11 != (Matrix4f *)0x0 && !bVar15)) {
                this_00 = Element::GetElementBackgroundBorder(this_01);
                local_a8 = (Vector2f)
                           ElementBackgroundBorder::GetClipGeometry(this_00,this_01,local_ec);
                fVar19 = (float)((uint)((out_clip_mask_list->
                                        super__Vector_base<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>
                                        )._M_impl.super__Vector_impl_data._M_start !=
                                       (out_clip_mask_list->
                                       super__Vector_base<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>
                                       )._M_impl.super__Vector_impl_data._M_finish) * 2);
                local_58 = Element::GetAbsoluteOffset(this_01,Border);
                local_48 = Math::Round(local_58.x);
                fVar18 = Math::Round(local_58.y);
                local_88._8_4_ = local_a8.x;
                local_88._12_4_ = local_a8.y;
                local_88._20_4_ = fVar18;
                local_88._16_4_ = local_48;
                __position._M_current =
                     (out_clip_mask_list->
                     super__Vector_base<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                VVar12 = local_a8;
                local_88._0_4_ = fVar19;
                pMStack_70 = pMVar11;
                if (__position._M_current ==
                    (out_clip_mask_list->
                    super__Vector_base<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  ::std::vector<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>::
                  _M_realloc_insert<Rml::ClipMaskGeometry>
                            (out_clip_mask_list,__position,(ClipMaskGeometry *)local_88);
                }
                else {
                  (__position._M_current)->absolute_offset = (Vector2f)local_88._16_8_;
                  (__position._M_current)->transform = pMVar11;
                  *(ulong *)__position._M_current = CONCAT44(local_88._4_4_,fVar19);
                  (__position._M_current)->geometry = (Geometry *)local_a8;
                  ppCVar1 = &(out_clip_mask_list->
                             super__Vector_base<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
                  *ppCVar1 = *ppCVar1 + 1;
                }
              }
              bVar16 = pMVar11 != (Matrix4f *)0x0;
            }
            if (bVar15 || bVar16) goto LAB_00232957;
            local_a8 = Element::GetAbsoluteOffset(this_01,local_ec);
            fVar19 = Math::Round(local_a8.x);
            fVar18 = Math::Round(local_a8.y);
            VVar12.x = 0.0;
            VVar12.y = 0.0;
            Element::GetRenderBox((RenderBox *)local_88,this_01,local_ec,0);
            local_88._12_4_ = (float)local_88._4_4_ + fVar18;
            local_88._8_4_ = (float)local_88._0_4_ + fVar19;
            local_88._0_4_ = fVar19;
            local_88._4_4_ = fVar18;
            local_c0 = Rectangle<float>::IntersectIfValid((Rectangle<float> *)local_88,local_c0);
            bVar15 = uVar13 != 0 &&
                     ((undefined1  [96])CVar8 & (undefined1  [96])0x3c00) != (undefined1  [96])0x0;
          }
          else {
LAB_00232957:
            VVar12.x._0_1_ =
                 uVar13 != 0 &&
                 ((undefined1  [96])CVar8 & (undefined1  [96])0x3c00) != (undefined1  [96])0x0;
            bVar15 = (bool)VVar12.x._0_1_;
          }
          uVar14 = uVar13 - bVar15;
          if ((int)(uVar13 - bVar15) <= (int)uVar9) {
            uVar14 = uVar9;
          }
          uVar13 = uVar14;
          if (bVar7) break;
        }
        else {
          if (bVar6 == 0xff) {
            bVar7 = true;
            uVar9 = 0;
            goto LAB_00232757;
          }
          uVar9 = 0;
          if ('\0' < (char)bVar6) {
            uVar9 = (uint)bVar6;
          }
          if (bVar6 != 0xfe) {
            bVar7 = false;
            goto LAB_00232757;
          }
          if (uVar13 == 0 || bVar15 && force_clip_self) {
            if (bVar15 && force_clip_self) {
              local_ec = Border;
            }
            else {
              local_ec = Element::GetClipArea(this_01);
            }
            bVar7 = false;
            goto LAB_00232816;
          }
          uVar13 = (uVar13 - 1) +
                   (uint)(((undefined1  [96])CVar8 & (undefined1  [96])0x3c00) ==
                         (undefined1  [96])0x0);
          if (uVar13 <= uVar9) {
            uVar13 = uVar9;
          }
        }
        this_01 = Element::GetOffsetParent(this_01);
      } while (this_01 != (Element *)0x0);
      if ((local_c0.p0.x <= local_c0.p1.x) && (local_c0.p0.y <= local_c0.p1.y)) {
        Math::SnapToPixelGrid(&local_c0);
        (local_90->p0).x = (int)local_c0.p0.x;
        (local_90->p0).y = (int)local_c0.p0.y;
        (local_90->p1).x = (int)local_c0.p1.x;
        (local_90->p1).y = (int)local_c0.p1.y;
      }
    }
    else {
      local_c0.p0.y = 0.0;
      local_c0.p1.y = -1.0;
      local_c0.p1.x = -1.0;
      local_c0.p0.x = 0.0;
    }
    bVar17 = -(local_c0.p0.x <= local_c0.p1.x && local_c0.p0.y <= local_c0.p1.y);
  }
  return (bool)(bVar17 & 1);
}

Assistant:

bool ElementUtilities::GetClippingRegion(Element* element, Rectanglei& out_clip_region, ClipMaskGeometryList* out_clip_mask_list,
	bool force_clip_self)
{
	using Style::Clip;
	Clip target_element_clip = element->GetComputedValues().clip();
	if (target_element_clip == Clip::Type::None && !force_clip_self)
		return false;

	int num_ignored_clips = target_element_clip.GetNumber();

	// Search through the element's ancestors, finding all elements that clip their overflow and have overflow to clip.
	// For each that we find, we combine their clipping region with the existing clipping region, and so build up a
	// complete clipping region for the element.
	Element* clipping_element = (force_clip_self ? element : element->GetOffsetParent());

	Rectanglef clip_region = Rectanglef::MakeInvalid();

	while (clipping_element)
	{
		const bool force_clip_current_element = (force_clip_self && clipping_element == element);
		const ComputedValues& clip_computed = clipping_element->GetComputedValues();
		const bool clip_enabled = (clip_computed.overflow_x() != Style::Overflow::Visible || clip_computed.overflow_y() != Style::Overflow::Visible);
		const bool clip_always = (clip_computed.clip() == Clip::Type::Always);
		const bool clip_none = (clip_computed.clip() == Clip::Type::None);
		const int clip_number = clip_computed.clip().GetNumber();

		// Merge the existing clip region with the current clip region, unless we are ignoring clip regions.
		if (((clip_always || clip_enabled) && num_ignored_clips == 0) || force_clip_current_element)
		{
			const BoxArea clip_area = (force_clip_current_element ? BoxArea::Border : clipping_element->GetClipArea());
			const bool has_clipping_content =
				(clip_always || force_clip_current_element || clipping_element->GetClientWidth() < clipping_element->GetScrollWidth() - 0.5f ||
					clipping_element->GetClientHeight() < clipping_element->GetScrollHeight() - 0.5f);
			bool disable_scissor_clipping = false;

			if (out_clip_mask_list)
			{
				const TransformState* transform_state = clipping_element->GetTransformState();
				const Matrix4f* transform = (transform_state ? transform_state->GetTransform() : nullptr);
				const bool has_border_radius = (clip_computed.border_top_left_radius() > 0.f || clip_computed.border_top_right_radius() > 0.f ||
					clip_computed.border_bottom_right_radius() > 0.f || clip_computed.border_bottom_left_radius() > 0.f);

				// If the element has border-radius we always use a clip mask, since we can't easily predict if content is located on the curved
				// region to be clipped. If the element has a transform we only use a clip mask when the content clips.
				if (has_border_radius || (transform && has_clipping_content))
				{
					Geometry* clip_geometry = clipping_element->GetElementBackgroundBorder()->GetClipGeometry(clipping_element, clip_area);
					const ClipMaskOperation clip_operation = (out_clip_mask_list->empty() ? ClipMaskOperation::Set : ClipMaskOperation::Intersect);
					const Vector2f absolute_offset = clipping_element->GetAbsoluteOffset(BoxArea::Border).Round();
					out_clip_mask_list->push_back(ClipMaskGeometry{clip_operation, clip_geometry, absolute_offset, transform});
				}

				// If we only have border-radius then we add this element to the scissor region as well as the clip mask. This may help with e.g.
				// culling text render calls. However, when we have a transform, the element cannot be added to the scissor region since its geometry
				// may be projected entirely elsewhere.
				if (transform)
					disable_scissor_clipping = true;
			}

			if (has_clipping_content && !disable_scissor_clipping)
			{
				// Shrink the scissor region to the element's client area.
				Vector2f element_offset = clipping_element->GetAbsoluteOffset(clip_area).Round();
				Vector2f element_size = clipping_element->GetRenderBox(clip_area).GetFillSize();
				Rectanglef element_region = Rectanglef::FromPositionSize(element_offset, element_size);

				clip_region = element_region.IntersectIfValid(clip_region);
			}
		}

		// If this region is meant to clip and we're skipping regions, update the counter.
		if (num_ignored_clips > 0 && clip_enabled)
			num_ignored_clips--;

		// Inherit how many clip regions this ancestor ignores.
		num_ignored_clips = Math::Max(num_ignored_clips, clip_number);

		// If this region ignores all clipping regions, then we do too.
		if (clip_none)
			break;

		// Climb the tree to this region's parent.
		clipping_element = clipping_element->GetOffsetParent();
	}

	if (clip_region.Valid())
	{
		Math::SnapToPixelGrid(clip_region);
		out_clip_region = Rectanglei(clip_region);
	}

	return clip_region.Valid();
}